

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AnnotatesMapSemantics_Test::
TestBody(CppMetadataTest_AnnotatesMapSemantics_Test *this)

{
  char *pcVar1;
  pointer ppGVar2;
  void *pvVar3;
  long lVar4;
  pointer ppGVar5;
  bool bVar6;
  int iVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar8;
  GeneratedCodeInfo *in_R8;
  undefined1 annotation [8];
  string *in_R9;
  pointer *__ptr;
  long *plVar9;
  size_type __rlen;
  initializer_list<int> __l;
  string_view data;
  string_view file_content;
  string_view filename;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  annotations;
  vector<int,_std::allocator<int>_> field_path;
  AssertionResult gtest_ar__1;
  string pb_h;
  GeneratedCodeInfo info;
  FileDescriptorProto file;
  GeneratedCodeInfo *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined1 local_1f8 [8];
  undefined1 auStack_1f0 [8];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  local_1c8;
  undefined1 local_1b0 [16];
  pointer local_1a0;
  AssertHelper local_198;
  undefined1 local_190 [16];
  bool local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  GeneratedCodeInfo local_158;
  undefined1 local_128 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_128,(Arena *)0x0);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)(local_168 + 0x10),(Arena *)0x0);
  local_178._0_8_ = local_168;
  local_178._8_8_ = (annotation_test_util *)0x0;
  local_168[0] = 0;
  data._M_str = 
  "\n  syntax = \"proto2\";\n  package foo;\n  message Message {\n    map<string, int32> mfield = 1;\n  }\n"
  ;
  data._M_len = 0x60;
  filename._M_str = "test.proto";
  filename._M_len = 10;
  annotation_test_util::AddFile(filename,data);
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test.proto","");
  local_1b0[0] = CppMetadataTest::CaptureMetadata
                           ((CppMetadataTest *)local_1f8,(string *)local_128,
                            (FileDescriptorProto *)local_178,(string *)(local_168 + 0x10),in_R8,
                            in_R9,in_stack_fffffffffffffdf8,
                            (string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00))
  ;
  local_1b0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  if (local_1b0[0] == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_1b0,
               (AssertionResult *)
               "CaptureMetadata(\"test.proto\", &file, &pb_h, &info, nullptr, nullptr, nullptr)",
               "false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0xe1,(char *)local_1f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_190,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_190);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    }
    if (local_1c8.
        super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1b0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1b0._8_8_);
  }
  pVVar8 = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     ((RepeatedPtrFieldBase *)(local_128 + 0x30),0);
  annotation = (undefined1  [8])
               ((ulong)(pVVar8->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)local_1f8,"\"Message\"","file.message_type(0).name()",
             (char (*) [8])0x11a6e10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)annotation);
  if (local_1f8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
         )auStack_1f0 ==
        (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
         )0x0) {
      annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
    }
    else {
      annotation = *(undefined1 (*) [8])auStack_1f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0xe2,(char *)annotation);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((long *)CONCAT71(local_1b0._1_7_,local_1b0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1b0._1_7_,local_1b0[0]) + 8))();
    }
  }
  if (auStack_1f0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1f0);
  }
  local_1f8 = (undefined1  [8])&DAT_00000004;
  auStack_1f0 = (undefined1  [8])0x2;
  __l._M_len = 4;
  __l._M_array = (iterator)local_1f8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1b0,__l,(allocator_type *)&local_1c8);
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test.proto","");
  annotation_test_util::FindAnnotationsOnPath
            ((GeneratedCodeInfo *)(local_168 + 0x10),(string *)local_1f8,
             (vector<int,_std::allocator<int>_> *)local_1b0,&local_1c8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  local_190[0] = local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_190._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_190[0]) {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_190,(AssertionResult *)"!annotations.empty()",
               "false","true",(char *)in_R9);
    annotation = local_1f8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0xe7,(char *)local_1f8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_190 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_190._8_8_);
  }
  ppGVar5 = local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppGVar2 = local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    while( true ) {
      plVar9 = (long *)ppGVar2 + 1;
      pcVar1 = (char *)*ppGVar2;
      file_content._M_str = pcVar1;
      file_content._M_len = local_178._0_8_;
      annotation_test_util::GetAnnotationSubstring
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_190,
                 (annotation_test_util *)local_178._8_8_,file_content,(Annotation *)annotation);
      bVar6 = local_180;
      local_1d8[0] = local_180;
      local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_180 == false) break;
      lVar4 = CONCAT71(local_190._1_7_,local_190[0]);
      if (lVar4 == 0xe) {
        local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        iVar7 = bcmp((void *)local_190._8_8_,"mutable_mfield",0xe);
        if (iVar7 == 0) {
          local_1d8._0_4_ = (uint32_t  [1])0x2;
          in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
          annotation = (undefined1  [8])&stack0xfffffffffffffe00;
          testing::internal::
          CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                    ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_ALIAS",
                     "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                     (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
          if (local_1f8[0] == (string)0x0) {
            testing::Message::Message((Message *)local_1d8);
            annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
            if (auStack_1f0 != (undefined1  [8])0x0) {
              annotation = *(undefined1 (*) [8])auStack_1f0;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                       ,0xf3,(char *)annotation);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
            goto LAB_00a45625;
          }
          goto LAB_00a4563d;
        }
      }
      else if (lVar4 == 0xc) {
        local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        iVar7 = bcmp((void *)local_190._8_8_,"clear_mfield",0xc);
        if (iVar7 == 0) {
          local_1d8._0_4_ = (uint32_t  [1])0x1;
          in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
          annotation = (undefined1  [8])&stack0xfffffffffffffe00;
          testing::internal::
          CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                    ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_SET",
                     "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                     (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
          if (local_1f8[0] == (string)0x0) {
            testing::Message::Message((Message *)local_1d8);
            annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
            if ((_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                 )auStack_1f0 != (GTestFlagSaver *)0x0) {
              annotation = *(undefined1 (*) [8])auStack_1f0;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                       ,0xf0,(char *)annotation);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
            goto LAB_00a45625;
          }
          goto LAB_00a4563d;
        }
      }
      else if ((lVar4 == 6) && (iVar7 = bcmp((void *)local_190._8_8_,"mfield",6), iVar7 == 0)) {
        local_1d8._0_4_ = (uint32_t  [1])0x0;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_NONE",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_1d8);
          annotation = (undefined1  [8])(anon_var_dwarf_a12c75 + 5);
          if ((_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )auStack_1f0 != (GTestFlagSaver *)0x0) {
            annotation = *(undefined1 (*) [8])auStack_1f0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0xed,(char *)annotation);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
LAB_00a45625:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
          if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
          }
        }
LAB_00a4563d:
        if ((_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
             )auStack_1f0 != (GTestFlagSaver *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_1f0);
        }
      }
      if ((bVar6 == false) || (ppGVar2 = (pointer)plVar9, (pointer)plVar9 == ppGVar5))
      goto LAB_00a45716;
    }
    testing::Message::Message((Message *)&stack0xfffffffffffffe00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_1d8,(AssertionResult *)"substring.has_value()",
               "false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0xea,(char *)local_1f8);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&stack0xfffffffffffffe00);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    }
    if ((long *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1d8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1d8._8_8_);
    }
  }
LAB_00a45716:
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_1b0._1_7_,local_1b0[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_1a0 - (long)pvVar3);
  }
  if ((undefined1 *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_,CONCAT71(local_168._1_7_,local_168[0]) + 1);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)(local_168 + 0x10));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_128);
  return;
}

Assistant:

TEST_F(CppMetadataTest, AnnotatesMapSemantics) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kMapFieldTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_EQ("Message", file.message_type(0).name());
  std::vector<int> field_path{FileDescriptorProto::kMessageTypeFieldNumber, 0,
                              DescriptorProto::kFieldFieldNumber, 0};
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "clear_mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
}